

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_1::
multithreadedCreatePerThreadResourcesTest<vkt::api::(anonymous_namespace)::DescriptorSetLayout>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  TestStatus *pTVar1;
  deUint32 dVar2;
  Resources *this;
  CreateThread<vkt::api::(anonymous_namespace)::DescriptorSetLayout> *this_00;
  allocator_type *__a;
  pointer this_01;
  ulong __n;
  bool bVar3;
  MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
  local_d8;
  TestStatus *local_c8;
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Resources>_>_>
  resources;
  ThreadGroup threads;
  SharedPtr<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Resources> local_78;
  Environment env;
  
  local_c8 = __return_storage_ptr__;
  dVar2 = getDefaultTestThreadCount();
  Environment::Environment(&env,context,1);
  __n = (ulong)dVar2;
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Resources>_>_>
  ::vector(&resources,__n,__a);
  ThreadGroup::ThreadGroup(&threads);
  this_01 = resources.
            super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Resources>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  while (pTVar1 = local_c8, bVar3 = __n != 0, __n = __n - 1, bVar3) {
    this = (Resources *)operator_new(0x40);
    DescriptorSetLayout::Resources::Resources(this,&env,params);
    de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Resources>::SharedPtr
              (&local_78,this);
    de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Resources>::operator=
              (this_01,&local_78);
    de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Resources>::release
              (&local_78);
    this_00 = (CreateThread<vkt::api::(anonymous_namespace)::DescriptorSetLayout> *)
              operator_new(0x88);
    CreateThread<vkt::api::(anonymous_namespace)::DescriptorSetLayout>::CreateThread
              (this_00,&env,this_01->m_ptr,params);
    local_d8.
    super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    .m_data.ptr = (ThreadGroupThread *)this_00;
    ThreadGroup::add(&threads,&local_d8);
    if ((CreateThread<vkt::api::(anonymous_namespace)::DescriptorSetLayout> *)
        local_d8.
        super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
        .m_data.ptr != (CreateThread<vkt::api::(anonymous_namespace)::DescriptorSetLayout> *)0x0) {
      (*(((ThreadGroupThread *)
         &(local_d8.
           super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
           .m_data.ptr)->super_Thread)->super_Thread)._vptr_Thread[1])();
      local_d8.
      super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
      .m_data.ptr = (ThreadGroupThread *)0x0;
    }
    this_01 = this_01 + 1;
  }
  ThreadGroup::run(local_c8,&threads);
  ThreadGroup::~ThreadGroup(&threads);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Resources>_>_>
  ::~vector(&resources);
  return pTVar1;
}

Assistant:

tcu::TestStatus multithreadedCreatePerThreadResourcesTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<typename Object::Resources>	ResPtr;

	const deUint32		numThreads	= getDefaultTestThreadCount();
	const Environment	env			(context, 1u);
	vector<ResPtr>		resources	(numThreads);
	ThreadGroup			threads;

	for (deUint32 ndx = 0; ndx < numThreads; ndx++)
	{
		resources[ndx] = ResPtr(new typename Object::Resources(env, params));
		threads.add(MovePtr<ThreadGroupThread>(new CreateThread<Object>(env, *resources[ndx], params)));
	}

	return threads.run();
}